

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O2

void __thiscall squall::TableBase::call<void>(TableBase *this,string *name)

{
  detail::call<void>(this->vm_,&this->tableobj_,name);
  return;
}

Assistant:

R call(const string& name, T... args) {
        return detail::call<R>(vm_, tableobj_, name, args...);
    }